

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  double dVar1;
  iterator iVar2;
  ChebyshevExpansion *this_00;
  long lVar3;
  long lVar4;
  double val_n11;
  VectorXcd eigs;
  VectorXd new_mc;
  double x;
  void *local_68;
  long local_60;
  VectorXd local_58;
  MatrixXd local_48;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this;
  reduce_zeros((ChebyshevExpansion *)&local_58,&this->m_c);
  if (1 < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  {
    if (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        2) {
      if ((!only_in_domain) ||
         (ABS(-*local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data /
              local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[1]) <= 1.0)) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)
             (((this->m_xmax - this->m_xmin) *
               (-*local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data /
               local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[1]) + this->m_xmax + this->m_xmin) * 0.5);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,
                     (double *)&local_48);
        }
        else {
          *iVar2._M_current =
               (double)local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
    }
    else {
      companion_matrix(&local_48,this_00,&local_58);
      eigenvalues((ChebTools *)&local_68,&local_48,true);
      free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      if (0 < local_60) {
        lVar3 = 8;
        lVar4 = 0;
        do {
          dVar1 = *(double *)((long)local_68 + lVar3 + -8);
          if ((ABS(*(double *)((long)local_68 + lVar3) / dVar1) < 1e-15) &&
             (ABS(dVar1) <= 1.0 || !only_in_domain)) {
            local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)
                     (((this->m_xmax - this->m_xmin) * dVar1 + this->m_xmax + this->m_xmin) * 0.5);
            iVar2._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar2,
                         (double *)&local_48);
            }
            else {
              *iVar2._M_current =
                   (double)local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_data;
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + 0x10;
        } while (lVar4 < local_60);
      }
      free(local_68);
    }
  }
  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots(bool only_in_domain) const {
      //vector of roots to be returned
        std::vector<double> roots;
        Eigen::VectorXd new_mc = reduce_zeros(m_c);
        //if the Chebyshev polynomial is just a constant, then there are no roots
        //if a_0=0 then there are infinite roots, but for our purposes, infinite roots doesnt make sense
        if (new_mc.size()<=1){ //we choose <=1 to account for the case of no coefficients
          return roots; //roots is empty
        }

        //if the Chebyshev polynomial is linear, then the only possible root is -a_0/a_1
        //we have this else if block because eigen is not a fan of 1x1 matrices
        else if (new_mc.size()==2){
          double val_n11 = -new_mc(0)/new_mc(1);
          const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
          // Keep it if it is in domain, or if you just want all real roots
          if (!only_in_domain || is_in_domain) {
              // Rescale back into real-world values in [xmin,xmax] from [-1,1]
              double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
              roots.push_back(x);
          }
        }

        //this for all cases of higher order polynomials
        else{
          // The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
          // decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
          // in the domain [-1, 1], but it might also include values outside [-1, 1]
          Eigen::VectorXcd eigs = eigenvalues(companion_matrix(new_mc), /* balance = */ true);


          for (Eigen::Index i = 0; i < eigs.size(); ++i) {
              if (std::abs(eigs(i).imag() / eigs(i).real()) < 1e-15) {
                  double val_n11 = eigs(i).real();
                  const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
                  // Keep it if it is in domain, or if you just want all real roots
                  if (!only_in_domain || is_in_domain) {
                      // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                      double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
                      roots.push_back(x);
                  }
              }
          }
        }
        return roots;
    
    //// The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
    //// decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
    //// in the domain [-1, 1], but it might also include values outside [-1, 1]
    //Eigen::VectorXd real_eigs = eigenvalues_upperHessenberg(companion_matrix().transpose(), /* balance = */ true);
    //
    //std::vector<double> roots;
    //for (Eigen::Index i = 0; i < real_eigs.size(); ++i){
    //    double val_n11 = real_eigs(i);
    //    const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
    //    // Keep it if it is in domain, or if you just want all real roots
    //    if (!only_in_domain || is_in_domain){
    //        // Rescale back into real-world values in [xmin,xmax] from [-1,1]
    //        double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
    //        roots.push_back(x);
    //    }
    //}
    //return roots;
    }